

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_address.cpp
# Opt level: O3

int __thiscall zmq::tcp_address_t::resolve(tcp_address_t *this,char *name_,bool param_2,bool ipv6_)

{
  int iVar1;
  char *pcVar2;
  ip_resolver_options_t *piVar3;
  undefined7 in_register_00000011;
  bool bindable_;
  undefined4 uVar4;
  ip_resolver_options_t src_resolver_opts;
  ip_resolver_t resolver;
  ip_resolver_options_t resolver_opts;
  undefined8 local_70;
  undefined4 local_64;
  ip_resolver_t local_60;
  _func_int *local_50 [2];
  ip_resolver_t local_40;
  
  uVar4 = (undefined4)CONCAT71(in_register_00000011,param_2);
  pcVar2 = strrchr(name_,0x3b);
  if (pcVar2 != (char *)0x0) {
    local_64 = uVar4;
    local_60._vptr_ip_resolver_t = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,name_,pcVar2);
    ip_resolver_options_t::ip_resolver_options_t((ip_resolver_options_t *)&local_70);
    piVar3 = ip_resolver_options_t::bindable((ip_resolver_options_t *)&local_70,true);
    piVar3 = ip_resolver_options_t::allow_dns(piVar3,false);
    piVar3 = ip_resolver_options_t::allow_nic_name(piVar3,true);
    piVar3 = ip_resolver_options_t::ipv6(piVar3,ipv6_);
    ip_resolver_options_t::expect_port(piVar3,true);
    ip_resolver_t::ip_resolver_t
              (&local_40,
               (ip_resolver_options_t)((uint6)local_70._4_4_ << 0x20 | (uint6)(uint)local_70));
    iVar1 = ip_resolver_t::resolve
                      (&local_40,&this->_source_address,(char *)local_60._vptr_ip_resolver_t);
    if (iVar1 == 0) {
      name_ = pcVar2 + 1;
      this->_has_src_addr = true;
    }
    if (local_60._vptr_ip_resolver_t != local_50) {
      operator_delete(local_60._vptr_ip_resolver_t,(ulong)(local_50[0] + 1));
    }
    uVar4 = local_64;
    if (iVar1 != 0) {
      return -1;
    }
  }
  ip_resolver_options_t::ip_resolver_options_t((ip_resolver_options_t *)&local_40);
  bindable_ = SUB41(uVar4,0);
  piVar3 = ip_resolver_options_t::bindable((ip_resolver_options_t *)&local_40,bindable_);
  piVar3 = ip_resolver_options_t::allow_dns(piVar3,(bool)(bindable_ ^ 1));
  piVar3 = ip_resolver_options_t::allow_nic_name(piVar3,bindable_);
  piVar3 = ip_resolver_options_t::ipv6(piVar3,ipv6_);
  ip_resolver_options_t::expect_port(piVar3,true);
  ip_resolver_t::ip_resolver_t
            (&local_60,
             (ip_resolver_options_t)
             ((uint6)local_40._vptr_ip_resolver_t._4_4_ << 0x20 |
             (uint6)(uint)local_40._vptr_ip_resolver_t));
  iVar1 = ip_resolver_t::resolve(&local_60,&this->_address,name_);
  return iVar1;
}

Assistant:

int zmq::tcp_address_t::resolve (const char *name_, bool local_, bool ipv6_)
{
    // Test the ';' to know if we have a source address in name_
    const char *src_delimiter = strrchr (name_, ';');
    if (src_delimiter) {
        const std::string src_name (name_, src_delimiter - name_);

        ip_resolver_options_t src_resolver_opts;

        src_resolver_opts
          .bindable (true)
          //  Restrict hostname/service to literals to avoid any DNS
          //  lookups or service-name irregularity due to
          //  indeterminate socktype.
          .allow_dns (false)
          .allow_nic_name (true)
          .ipv6 (ipv6_)
          .expect_port (true);

        ip_resolver_t src_resolver (src_resolver_opts);

        const int rc =
          src_resolver.resolve (&_source_address, src_name.c_str ());
        if (rc != 0)
            return -1;
        name_ = src_delimiter + 1;
        _has_src_addr = true;
    }

    ip_resolver_options_t resolver_opts;

    resolver_opts.bindable (local_)
      .allow_dns (!local_)
      .allow_nic_name (local_)
      .ipv6 (ipv6_)
      .expect_port (true);

    ip_resolver_t resolver (resolver_opts);

    return resolver.resolve (&_address, name_);
}